

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::RoundRobinDoIt
          (DistributionMapping *this,int nboxes,int param_3,
          vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *LIpairV,bool sort)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Print *this_00;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *in_RCX;
  int in_ESI;
  byte in_R8B;
  int rank_1;
  int wid_1;
  int tid_1;
  int i_2;
  int rank;
  int wid;
  int tid;
  int i_1;
  Vector<int,_std::allocator<int>_> w;
  Vector<int,_std::allocator<int>_> *v;
  iterator __end3;
  iterator __begin3;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *__range3;
  int i;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  wrkerord;
  Vector<int,_std::allocator<int>_> ord;
  int nworkers;
  int nteams;
  int nprocs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff9a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff9b0;
  size_type in_stack_fffffffffffff9b8;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9c0;
  size_type in_stack_fffffffffffff9c8;
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  Print *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff9f0;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9f8;
  DistributionMapping *in_stack_fffffffffffffa00;
  Print *in_stack_fffffffffffffa20;
  int local_404;
  int local_26c;
  __normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
  local_228;
  undefined1 *local_220;
  int *local_218;
  int *local_210;
  int local_204;
  int *local_200;
  int *local_1f8;
  undefined1 local_1f0 [48];
  int local_1c0;
  int local_1bc;
  int local_1b8;
  byte local_19;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *local_18;
  int local_c;
  
  local_19 = in_R8B & 1;
  local_18 = in_RCX;
  local_c = in_ESI;
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    OutStream();
    Print::Print(in_stack_fffffffffffff9e0,
                 (ostream *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                      (char (*) [29])in_stack_fffffffffffff9a8._M_current);
    Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                      (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                       *)in_stack_fffffffffffff9a8._M_current);
    Print::~Print(in_stack_fffffffffffffa20);
  }
  local_1bc = ParallelContext::NProcsSub();
  local_1c0 = 1;
  local_1b8 = local_1bc;
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x11f2c56);
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::Vector((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
            *)0x11f2c63);
  if (local_1bc == local_1b8) {
    if ((local_19 & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8);
      local_1f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   (in_stack_fffffffffffff9a8._M_current);
      local_200 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   (in_stack_fffffffffffff9a8._M_current);
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,0);
    }
    else {
      LeastUsedCPUs((DistributionMapping *)in_stack_fffffffffffff9c0,
                    (int)(in_stack_fffffffffffff9b8 >> 0x20),
                    (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b0._M_current);
    }
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::resize(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    for (local_204 = 0; local_204 < local_1b8; local_204 = local_204 + 1) {
      Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
      ::operator[]((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffff9b0._M_current,
                   (size_type)in_stack_fffffffffffff9a8._M_current);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8);
      Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
      ::operator[]((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffff9b0._M_current,
                   (size_type)in_stack_fffffffffffff9a8._M_current);
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_fffffffffffff9b0._M_current,in_stack_fffffffffffff9a8._M_current)
      ;
      *piVar4 = 0;
    }
  }
  else if ((local_19 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    local_210 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 (in_stack_fffffffffffff9a8._M_current);
    local_218 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 (in_stack_fffffffffffff9a8._M_current);
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,0);
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::resize(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    local_220 = local_1f0;
    local_228._M_current =
         (Vector<int,_std::allocator<int>_> *)
         std::
         vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
         ::begin((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_fffffffffffff9a8._M_current);
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::end((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
           *)in_stack_fffffffffffff9a8._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_fffffffffffff9b0._M_current,
                              (__normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
                               *)in_stack_fffffffffffff9a8._M_current), bVar1) {
      __gnu_cxx::
      __normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::operator*(&local_228);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a8._M_current);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a8._M_current);
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,0);
      __gnu_cxx::
      __normal_iterator<amrex::Vector<int,_std::allocator<int>_>_*,_std::vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&local_228);
    }
  }
  else {
    LeastUsedTeams(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
                   (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),(int)in_stack_fffffffffffff9e8);
  }
  std::allocator<int>::allocator((allocator<int> *)0x11f2f78);
  Vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
             in_stack_fffffffffffff9b0._M_current,
             (allocator_type *)in_stack_fffffffffffff9a8._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x11f2fac);
  if (local_18 == (vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0x0) {
    for (local_404 = 0; local_404 < local_c; local_404 = local_404 + 1) {
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_fffffffffffff9b0._M_current,in_stack_fffffffffffff9a8._M_current)
      ;
      iVar2 = *piVar4;
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_fffffffffffff9b0._M_current,in_stack_fffffffffffff9a8._M_current)
      ;
      *piVar4 = *piVar4 + 1;
      iVar2 = iVar2 * local_1c0;
      Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
      ::operator[]((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffff9b0._M_current,
                   (size_type)in_stack_fffffffffffff9a8._M_current);
      Vector<int,_std::allocator<int>_>::operator[]
                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b0._M_current,
                 (size_type)in_stack_fffffffffffff9a8._M_current);
      iVar3 = ParallelContext::local_to_global_rank(0);
      std::
      __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x11f3332);
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_fffffffffffff9b0._M_current,in_stack_fffffffffffff9a8._M_current)
      ;
      *piVar4 = iVar3;
      if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
        OutStream();
        Print::Print(in_stack_fffffffffffff9e0,(ostream *)CONCAT44(iVar3,iVar2));
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (char (*) [15])in_stack_fffffffffffff9a8._M_current);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          in_stack_fffffffffffff9a8._M_current);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (char (*) [10])in_stack_fffffffffffff9a8._M_current);
        in_stack_fffffffffffff9b0._M_current =
             &Print::operator<<(in_stack_fffffffffffff9b0._M_current,
                                in_stack_fffffffffffff9a8._M_current)->rank;
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffff9a8._M_current);
        Print::~Print(in_stack_fffffffffffffa20);
      }
    }
  }
  else {
    for (local_26c = 0; local_26c < local_c; local_26c = local_26c + 1) {
      Vector<int,_std::allocator<int>_>::operator[]
                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b0._M_current,
                 (size_type)in_stack_fffffffffffff9a8._M_current);
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_fffffffffffff9b0._M_current,in_stack_fffffffffffff9a8._M_current)
      ;
      *piVar4 = *piVar4 + 1;
      Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
      ::operator[]((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffff9b0._M_current,
                   (size_type)in_stack_fffffffffffff9a8._M_current);
      Vector<int,_std::allocator<int>_>::operator[]
                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b0._M_current,
                 (size_type)in_stack_fffffffffffff9a8._M_current);
      iVar2 = ParallelContext::local_to_global_rank(0);
      this_00 = (Print *)std::
                         __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x11f309a);
      std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::operator[]
                (local_18,(long)local_26c);
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_fffffffffffff9b0._M_current,in_stack_fffffffffffff9a8._M_current)
      ;
      *piVar4 = iVar2;
      if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
        OutStream();
        Print::Print(in_stack_fffffffffffff9e0,
                     (ostream *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (char (*) [15])in_stack_fffffffffffff9a8._M_current);
        std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::operator[]
                  (local_18,(long)local_26c);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          in_stack_fffffffffffff9a8._M_current);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (char (*) [10])in_stack_fffffffffffff9a8._M_current);
        std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::operator[]
                  (local_18,(long)local_26c);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (long *)in_stack_fffffffffffff9a8._M_current);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (char (*) [10])in_stack_fffffffffffff9a8._M_current);
        in_stack_fffffffffffff9e0 =
             Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                               in_stack_fffffffffffff9a8._M_current);
        Print::operator<<((Print *)in_stack_fffffffffffff9b0._M_current,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffff9a8._M_current);
        Print::~Print(this_00);
      }
    }
  }
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x11f3446);
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::~Vector((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             *)0x11f3453);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x11f3460);
  return;
}

Assistant:

void
DistributionMapping::RoundRobinDoIt (int                  nboxes,
                                     int                 /* nprocs */,
                                     std::vector<LIpair>* LIpairV,
                                     bool                 sort)
{
    if (flag_verbose_mapper) {
        Print() << "DM: RoundRobinDoIt called..." << std::endl;
    }

    int nprocs = ParallelContext::NProcsSub();

    // If team is not use, we are going to treat it as a special case in which
    // the number of teams is nprocs and the number of workers is 1.

    int nteams = nprocs;
    int nworkers = 1;
#if defined(BL_USE_TEAM)
    nteams = ParallelDescriptor::NTeams();
    nworkers = ParallelDescriptor::TeamSize();
#endif

    Vector<int> ord;
    Vector<Vector<int> > wrkerord;

    if (nteams == nprocs)  {
        if (sort) {
            LeastUsedCPUs(nprocs,ord);
        } else {
            ord.resize(nprocs);
            std::iota(ord.begin(), ord.end(), 0);
        }
        wrkerord.resize(nprocs);
        for (int i = 0; i < nprocs; ++i) {
            wrkerord[i].resize(1);
            wrkerord[i][0] = 0;
        }
    } else {
        if (sort) {
            LeastUsedTeams(ord,wrkerord,nteams,nworkers);
        } else {
            ord.resize(nteams);
            std::iota(ord.begin(), ord.end(), 0);
            wrkerord.resize(nteams);
            for (auto& v : wrkerord) {
                v.resize(nworkers);
                std::iota(v.begin(), v.end(), 0);
            }
        }
    }

    Vector<int> w(nteams,0);

    if (LIpairV)
    {
        BL_ASSERT(static_cast<int>(LIpairV->size()) == nboxes);

        for (int i = 0; i < nboxes; ++i)
        {
            int tid = ord[i%nteams];
            int wid = (w[tid]++) % nworkers;
            int rank = tid*nworkers + wrkerord[tid][wid];
            m_ref->m_pmap[(*LIpairV)[i].second] = ParallelContext::local_to_global_rank(rank);
            if (flag_verbose_mapper) {
                Print() << "  Mapping box " << (*LIpairV)[i].second << " of size "
                        << (*LIpairV)[i].first << " to rank " << rank << std::endl;
            }
        }
    }
    else
    {
        for (int i = 0; i < nboxes; ++i)
        {
            int tid = ord[i%nteams];
            int wid = (w[tid]++) % nworkers;
            int rank = tid*nworkers + wrkerord[tid][wid];
            m_ref->m_pmap[i] = ParallelContext::local_to_global_rank(rank);
            if (flag_verbose_mapper) {
                Print() << "  Mapping box " << i << " to rank " << rank << std::endl;
            }
        }
    }
}